

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accelerometer-gyrometer.cpp
# Opt level: O1

void __thiscall
stateObservation::AccelerometerGyrometer::AccelerometerGyrometer(AccelerometerGyrometer *this)

{
  double *pdVar1;
  
  AlgebraicSensor::AlgebraicSensor(&this->super_AlgebraicSensor);
  (this->super_AlgebraicSensor).super_SensorBase._vptr_SensorBase =
       (_func_int **)&PTR__AccelerometerGyrometer_0018dc10;
  (this->super_LinearAcceleration)._vptr_LinearAcceleration =
       (_func_int **)&PTR__AccelerometerGyrometer_0018dca8;
  (this->super_RotationVelocity)._vptr_RotationVelocity =
       (_func_int **)&PTR__AccelerometerGyrometer_0018dcc8;
  (this->r_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
       = 0.0;
  (this->r_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
       = 0.0;
  (this->r_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
       = 0.0;
  (this->r_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3]
       = 0.0;
  (this->r_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4]
       = 0.0;
  (this->r_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5]
       = 0.0;
  (this->r_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6]
       = 0.0;
  (this->r_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7]
       = 0.0;
  (this->r_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]
       = 0.0;
  (this->acc_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0] = 0.0;
  (this->acc_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1] = 0.0;
  (this->acc_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = 0.0;
  (this->omega_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0] = 0.0;
  (this->omega_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1] = 0.0;
  (this->omega_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = 0.0;
  (this->output_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->output_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       0;
  if ((this->output_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_rows != 6) {
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)&this->output_,6,6,1);
  }
  if ((this->output_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_rows == 6) {
    pdVar1 = (this->output_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    pdVar1[4] = 0.0;
    pdVar1[5] = 0.0;
    pdVar1[2] = 0.0;
    pdVar1[3] = 0.0;
    *pdVar1 = 0.0;
    pdVar1[1] = 0.0;
    this->currentStateSize_ = 10;
    this->matrixMode_ = false;
    return;
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>, T1 = double, T2 = double]"
               );
}

Assistant:

AccelerometerGyrometer::AccelerometerGyrometer():
    r_(Matrix3::Zero()),
    acc_(Vector3::Zero()),
    omega_(Vector3::Zero()),
    output_(Vector::Zero(measurementSize_,1)),
    currentStateSize_(stateSize_)
    {
#ifdef STATEOBSERVATION_VERBOUS_CONSTRUCTORS
      std::cout<<std::endl<<"AccelerometerGyrometer Constructor"<<std::endl;
#endif //STATEOBSERVATION_VERBOUS_CONSTRUCTOR

      matrixMode_=false;
    }